

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

ExtPubkey * __thiscall
cfd::core::ExtPrivkey::DerivePubkey
          (ExtPubkey *__return_storage_ptr__,ExtPrivkey *this,uint32_t child_num)

{
  initializer_list<unsigned_int> __l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  allocator_type local_35;
  uint32_t local_34;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  __l._M_len = 1;
  __l._M_array = &local_34;
  local_34 = child_num;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_30,__l,&local_35);
  DerivePubkey(__return_storage_ptr__,this,&local_30);
  if (local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey ExtPrivkey::DerivePubkey(uint32_t child_num) const {
  std::vector<uint32_t> path = {child_num};
  return DerivePubkey(path);
}